

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O3

void __thiscall
asio::detail::
write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>
::operator()(write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  ulong uVar1;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *psVar2;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *psVar3;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *local_28;
  int local_20 [2];
  error_category *local_18;
  const_buffers_1 local_10;
  
  local_18 = ec._M_cat;
  local_10.super_const_buffer.data_ = &local_28;
  local_20[0] = ec._M_value;
  this->start_ = start;
  if (start == 1) {
    uVar1 = (ulong)(local_20[0] == 0) << 0x10;
    psVar3 = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
             (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
             super_const_buffer.size_;
    local_28 = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
               (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_
    ;
  }
  else {
    psVar3 = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
             (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
             super_const_buffer.size_;
    local_28 = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
               ((this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.
                total_consumed_ + bytes_transferred);
    (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_ =
         (size_t)local_28;
    if ((psVar3 <= local_28 || local_20[0] == 0 && bytes_transferred == 0) || local_20[0] != 0) {
      local_10.super_const_buffer.size_ = (size_t)local_20;
      std::
      _Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>
      ::__call<void,std::error_code_const&,unsigned_long_const&,0ul,1ul,2ul,3ul,4ul,5ul>
                ((_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>
                  *)&this->handler_);
      return;
    }
    uVar1 = 0x10000;
  }
  psVar2 = local_28;
  if (psVar3 < local_28) {
    psVar2 = psVar3;
  }
  local_28 = this->stream_;
  local_10.super_const_buffer.data_ =
       (void *)((long)(this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
                      super_const_buffer.data_ +
               (long)(&(psVar2->core_).pending_read_ + 0xffffffffffffffff) + 0x60U);
  local_10.super_const_buffer.size_ = (long)psVar3 - (long)psVar2;
  if (uVar1 <= (ulong)((long)psVar3 - (long)psVar2)) {
    local_10.super_const_buffer.size_ = uVar1;
  }
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
  initiate_async_write_some::operator()(&local_28,this,&local_10);
  return;
}

Assistant:

void operator()(asio::error_code ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        for (;;)
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_write"));
            stream_.async_write_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(write_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
          if (max_size == 0)
            break;
          if (this->cancelled() != cancellation_type::none)
          {
            ec = error::operation_aborted;
            break;
          }
        }

        ASIO_MOVE_OR_LVALUE(WriteHandler)(handler_)(
            static_cast<const asio::error_code&>(ec),
            static_cast<const std::size_t&>(buffers_.total_consumed()));
      }
    }